

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

_Bool chunk_copy(chunk_conflict *dest,player *p,chunk_conflict *source,wchar_t y0,wchar_t x0,
                wchar_t rotate,_Bool reflect)

{
  monster_group_info *pmVar1;
  int16_t iVar2;
  ushort uVar3;
  wchar_t wVar4;
  wchar_t width;
  bitflag *flags1;
  monster_race *pmVar5;
  monster_group *pmVar6;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  _Bool _Var12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  square *psVar16;
  object *poVar17;
  trap *ptVar18;
  object **ppoVar19;
  uint32_t uVar20;
  int iVar21;
  int iVar22;
  wchar_t wVar23;
  loc grid;
  monster *pmVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  mon_group_list_entry *pmVar28;
  long lVar29;
  loc grid_00;
  monster *__src;
  int iVar30;
  ulong uVar31;
  ghost_info preserved_ghost;
  wchar_t local_140;
  ulong local_138;
  int local_130;
  undefined1 local_e0 [176];
  
  wVar4 = source->height;
  if (wVar4 + y0 <= dest->height) {
    width = source->width;
    if (width + x0 <= dest->width) {
      lVar14 = (ulong)dest->mon_max - 1;
      if (L'\0' < wVar4) {
        wVar23 = rotate + L'\x03';
        if (L'\xffffffff' < rotate) {
          wVar23 = rotate;
        }
        iVar30 = rotate - (wVar23 & 0xfffffffcU);
        local_138 = 0;
        do {
          if (L'\0' < width) {
            uVar31 = 0;
            do {
              if (iVar30 < 1) {
                iVar22 = (int)local_138;
                uVar13 = (uint)uVar31;
                wVar23 = width;
              }
              else {
                uVar10 = uVar31 & 0xffffffff;
                uVar11 = (ulong)(uint)width;
                uVar27 = local_138 & 0xffffffff;
                uVar26 = (ulong)(uint)wVar4;
                iVar21 = iVar30;
                do {
                  uVar25 = uVar11;
                  uVar15 = uVar10;
                  wVar23 = (wchar_t)uVar26;
                  uVar13 = ~(uint)uVar27 + wVar23;
                  iVar22 = (int)uVar15;
                  iVar21 = iVar21 + -1;
                  uVar10 = (ulong)uVar13;
                  uVar11 = uVar26;
                  uVar27 = uVar15;
                  uVar26 = uVar25;
                } while (iVar21 != 0);
              }
              uVar9 = ~uVar13 + wVar23;
              if (!reflect) {
                uVar9 = uVar13;
              }
              wVar23 = iVar22 + y0;
              grid.x = uVar9 + x0;
              grid_00 = (loc)(local_138 << 0x20 | uVar31);
              psVar16 = square(source,grid_00);
              dest->squares[wVar23][grid.x].feat = psVar16->feat;
              grid.y = wVar23;
              psVar16 = square(dest,grid);
              flags1 = psVar16->info;
              psVar16 = square(source,grid_00);
              flag_copy(flags1,psVar16->info,3);
              poVar17 = square_object(source,grid_00);
              if (poVar17 != (object *)0x0) {
                poVar17 = square_object(source,grid_00);
                dest->squares[wVar23][grid.x].obj = poVar17;
                for (poVar17 = square_object(source,grid_00); poVar17 != (object *)0x0;
                    poVar17 = poVar17->next) {
                  poVar17->grid = grid;
                }
                source->squares[local_138][uVar31].obj = (object *)0x0;
              }
              psVar16 = square(source,grid_00);
              if (psVar16->trap != (trap *)0x0) {
                psVar16 = square(source,grid_00);
                ptVar18 = psVar16->trap;
                dest->squares[wVar23][grid.x].trap = ptVar18;
                for (; ptVar18 != (trap *)0x0; ptVar18 = ptVar18->next) {
                  ptVar18->grid = grid;
                }
                source->squares[local_138][uVar31].trap = (trap *)0x0;
              }
              psVar16 = square(source,grid_00);
              if (psVar16->mon == -1) {
                dest->squares[wVar23][grid.x].mon = -1;
                (p->grid).x = grid.x;
                (p->grid).y = wVar23;
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != (uint)width);
          }
          local_138 = local_138 + 1;
        } while (local_138 != (uint)wVar4);
      }
      dest->mon_max = dest->mon_max + source->mon_max;
      dest->mon_cnt = dest->mon_cnt + source->mon_cnt;
      dest->num_repro = dest->num_repro + source->num_repro;
      local_140 = L'\xffffffff';
      local_130 = (int)lVar14;
      if (1 < source->mon_max) {
        local_140 = L'\xffffffff';
        uVar31 = 1;
        do {
          pmVar5 = source->monsters[uVar31].race;
          if (pmVar5 != (monster_race *)0x0) {
            __src = source->monsters + uVar31;
            pmVar24 = dest->monsters;
            _Var12 = flag_has_dbg(pmVar5->flags,0xc,2,"source_mon->race->flags","RF_PLAYER_GHOST");
            if (_Var12) {
              if (dest->ghost->bones_selector == L'\0') {
                mem_free(dest->ghost);
                dest->ghost = source->ghost;
                source->ghost = (ghost_info *)0x0;
              }
              else {
                if (local_140 != L'\xffffffff') {
                  __assert_fail("skipped_ghost_id == -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                                ,0x1bb,
                                "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                               );
                }
                local_140 = __src->midx + local_130;
              }
            }
            pmVar24 = pmVar24 + uVar31 + lVar14;
            memcpy(pmVar24,__src,0x1f0);
            pmVar24->midx = pmVar24->midx + local_130;
            symmetry_transform(&pmVar24->grid,y0,x0,wVar4,width,rotate,reflect);
            iVar2 = (int16_t)pmVar24->midx;
            dest->squares[(pmVar24->grid).y][(pmVar24->grid).x].mon = iVar2;
            if (__src->held_obj != (object *)0x0) {
              pmVar24->held_obj = __src->held_obj;
              for (poVar17 = __src->held_obj; poVar17 != (object *)0x0; poVar17 = poVar17->next) {
                poVar17->held_m_idx = iVar2;
              }
              __src->held_obj = (object *)0x0;
            }
            poVar17 = __src->mimicked_obj;
            if (poVar17 != (object *)0x0) {
              pmVar24->mimicked_obj = poVar17;
              poVar17->mimicking_m_idx = iVar2;
              __src->mimicked_obj = (object *)0x0;
            }
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 < source->mon_max);
      }
      iVar30 = 0;
      if (1 < (ulong)z_info->level_monster_max) {
        uVar31 = 0;
        uVar26 = 1;
        do {
          if (dest->monster_groups[uVar26] != (monster_group *)0x0) {
            uVar31 = uVar26 & 0xffffffff;
          }
          iVar30 = (int)uVar31;
          uVar26 = uVar26 + 1;
        } while (z_info->level_monster_max != uVar26);
      }
      if (1 < (int)((uint)z_info->level_monster_max - iVar30)) {
        lVar14 = 1;
        do {
          pmVar6 = source->monster_groups[lVar14];
          dest->monster_groups[lVar14 + iVar30] = pmVar6;
          if (pmVar6 != (monster_group *)0x0) {
            pmVar28 = pmVar6->member_list;
            pmVar6->index = pmVar6->index + iVar30;
            pmVar6->leader = pmVar6->leader + local_130;
            if (pmVar28 != (mon_group_list_entry *)0x0) {
              pmVar24 = dest->monsters;
              do {
                lVar29 = (long)pmVar28->midx + (long)local_130;
                wVar4 = pmVar24[lVar29].midx;
                pmVar28->midx = wVar4;
                if (wVar4 != (wchar_t)lVar29) {
                  __assert_fail("entry->midx == mon_skip + idx",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                                ,0x1f6,
                                "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                               );
                }
                pmVar1 = pmVar24[lVar29].group_info;
                pmVar1->index = pmVar1->index + iVar30;
                pmVar28 = pmVar28->next;
              } while (pmVar28 != (mon_group_list_entry *)0x0);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (long)((ulong)z_info->level_monster_max - (long)iVar30));
      }
      monster_groups_verify(dest);
      ppoVar19 = (object **)
                 mem_realloc(dest->objects,
                             (ulong)((uint)source->obj_max + (uint)dest->obj_max) * 8 + 0x10);
      dest->objects = ppoVar19;
      uVar3 = source->obj_max;
      uVar31 = (ulong)dest->obj_max;
      lVar14 = (ulong)uVar3 + 1;
      lVar29 = 0;
      do {
        dest->objects[uVar31] = *(object **)((long)source->objects + lVar29);
        if (dest->objects[uVar31] != (object *)0x0) {
          dest->objects[uVar31]->oidx = (uint16_t)uVar31;
        }
        *(undefined8 *)((long)source->objects + lVar29) = 0;
        uVar31 = uVar31 + 1;
        lVar29 = lVar29 + 8;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      dest->obj_max = dest->obj_max + uVar3 + 1;
      source->obj_max = 1;
      lVar14 = 0;
      object_lists_check_integrity(dest,(chunk_conflict *)0x0);
      uVar3 = z_info->f_max;
      piVar7 = source->feat_count;
      piVar8 = dest->feat_count;
      do {
        piVar8[lVar14] = piVar8[lVar14] + piVar7[lVar14];
        lVar14 = lVar14 + 1;
      } while ((ulong)uVar3 + 1 != lVar14);
      uVar20 = 0xffffffff;
      if (!CARRY4(source->obj_rating,dest->obj_rating)) {
        uVar20 = source->obj_rating + dest->obj_rating;
      }
      dest->obj_rating = uVar20;
      add_to_monster_rating((chunk *)dest,source->mon_rating);
      if (source->good_item == true) {
        dest->good_item = true;
      }
      if (local_140 == L'\xffffffff') {
        return true;
      }
      memcpy(local_e0,dest->ghost,0xb0);
      delete_monster_idx((chunk *)dest,local_140);
      memcpy(dest->ghost,local_e0,0xb0);
      uVar13 = dest->mon_rating;
      if (uVar13 == 0xffffffff) {
        return true;
      }
      if (9 < uVar13) {
        dest->mon_rating = uVar13 - 10;
        return true;
      }
      __assert_fail("dest->mon_rating >= 10",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                    ,0x229,
                    "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                   );
    }
  }
  return false;
}

Assistant:

bool chunk_copy(struct chunk *dest, struct player *p, struct chunk *source,
		int y0, int x0, int rotate, bool reflect)
{
	int i, max_group_id = 0;
	struct loc grid;
	int h = source->height, w = source->width;
	int mon_skip = dest->mon_max - 1;
	int skipped_ghost_id = -1;

	/* Check bounds */
	if (rotate % 1) {
		if ((w + y0 > dest->height) || (h + x0 > dest->width))
			return false;
	} else {
		if ((h + y0 > dest->height) || (w + x0 > dest->width))
			return false;
	}

	/* Write the location stuff (terrain, objects, traps) */
	for (grid.y = 0; grid.y < h; grid.y++) {
		for (grid.x = 0; grid.x < w; grid.x++) {
			/* Work out where we're going */
			struct loc dest_grid = grid;
			symmetry_transform(&dest_grid, y0, x0, h, w, rotate, reflect);

			/* Terrain */
			dest->squares[dest_grid.y][dest_grid.x].feat =
				square(source, grid)->feat;
			sqinfo_copy(square(dest, dest_grid)->info,
						square(source, grid)->info);

			/* Dungeon objects */
			if (square_object(source, grid)) {
				struct object *obj;
				dest->squares[dest_grid.y][dest_grid.x].obj =
					square_object(source, grid);

				for (obj = square_object(source, grid); obj; obj = obj->next) {
					/* Adjust position */
					obj->grid = dest_grid;
				}
				source->squares[grid.y][grid.x].obj = NULL;
			}

			/* Traps */
			if (square(source, grid)->trap) {
				struct trap *trap = square(source, grid)->trap;
				dest->squares[dest_grid.y][dest_grid.x].trap = trap;

				/* Traverse the trap list */
				while (trap) {
					/* Adjust location */
					trap->grid = dest_grid;
					trap = trap->next;
				}
				source->squares[grid.y][grid.x].trap = NULL;
			}

			/* Player */
			if (square(source, grid)->mon == -1) {
				dest->squares[dest_grid.y][dest_grid.x].mon = -1;
				p->grid = dest_grid;
			}
		}
	}

	/* Monsters */
	dest->mon_max += source->mon_max;
	dest->mon_cnt += source->mon_cnt;
	dest->num_repro += source->num_repro;
	for (i = 1; i < source->mon_max; i++) {
		struct monster *source_mon = &source->monsters[i];
		struct monster *dest_mon = &dest->monsters[mon_skip + i];

		/* Valid monster */
		if (!source_mon->race) continue;

		/* Deal with player ghosts */
		if (source_mon->race &&
			rf_has(source_mon->race->flags, RF_PLAYER_GHOST)) {
			/*
			 * Only allow one ghost, preferring the ghost from
			 * the destination if both chunks have a ghost.
			 * Remember a ghost from the source that was not
			 * put in dest->ghost so it can be deleted once the
			 * monsters and monster groups are copied.
			 */
			if (dest->ghost->bones_selector) {
				/* source should not have multiple ghosts. */
				assert(skipped_ghost_id == -1);
				skipped_ghost_id = source_mon->midx + mon_skip;
			} else {
				/* Shift the ghost */
				mem_free(dest->ghost);
				dest->ghost = source->ghost;
				source->ghost = NULL;
			}
		}

		/* Copy */
		memcpy(dest_mon, source_mon, sizeof(struct monster));

		/* Adjust monster index */
		dest_mon->midx += mon_skip;

		/* Move grid */
		symmetry_transform(&dest_mon->grid, y0, x0, h, w, rotate, reflect);
		dest->squares[dest_mon->grid.y][dest_mon->grid.x].mon = dest_mon->midx;

		/* Held or mimicked objects */
		if (source_mon->held_obj) {
			struct object *obj;
			dest_mon->held_obj = source_mon->held_obj;
			for (obj = source_mon->held_obj; obj; obj = obj->next) {
				obj->held_m_idx = dest_mon->midx;
			}
			source_mon->held_obj = NULL;
		}
		if (source_mon->mimicked_obj) {
			dest_mon->mimicked_obj = source_mon->mimicked_obj;
			dest_mon->mimicked_obj->mimicking_m_idx =
				dest_mon->midx;
			source_mon->mimicked_obj = NULL;
		}
	}

	/* Find max monster group id */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (dest->monster_groups[i]) max_group_id = i;
	}

	/* Copy monster groups */
	for (i = 1; i < z_info->level_monster_max - max_group_id; i++) {
		struct monster_group *group = source->monster_groups[i];
		struct mon_group_list_entry *entry;

		/* Copy monster group list */
		dest->monster_groups[i + max_group_id] = source->monster_groups[i];

		/* Adjust monster group indices */
		if (!group) continue;
		entry = group->member_list;
		group->index += max_group_id;
		group->leader += mon_skip;
		while (entry) {
			int idx = entry->midx;
			struct monster *mon = &dest->monsters[mon_skip + idx];
			entry->midx = mon->midx;
			assert(entry->midx == mon_skip + idx);
			mon->group_info[0].index += max_group_id;
			entry = entry->next;
		}
	}
	monster_groups_verify(dest);

	/* Copy object list */
	dest->objects = mem_realloc(dest->objects,
								(dest->obj_max + source->obj_max + 2)
								* sizeof(struct object*));
	for (i = 0; i <= source->obj_max; i++) {
		dest->objects[dest->obj_max + i] = source->objects[i];
		if (dest->objects[dest->obj_max + i] != NULL)
			dest->objects[dest->obj_max + i]->oidx = dest->obj_max + i;
		source->objects[i] = NULL;
	}
	dest->obj_max += source->obj_max + 1;
	source->obj_max = 1;
	object_lists_check_integrity(dest, NULL);

	/* Miscellany */
	for (i = 0; i < z_info->f_max + 1; i++)
		dest->feat_count[i] += source->feat_count[i];

	if (dest->obj_rating < UINT32_MAX - source->obj_rating) {
		dest->obj_rating += source->obj_rating;
	} else {
		dest->obj_rating = UINT32_MAX;
	}
	add_to_monster_rating(dest, source->mon_rating);

	if (source->good_item)
		dest->good_item = true;

	if (skipped_ghost_id != -1) {
		/*
		 * dest->ghost does not refer to the ghost at skipped_ghost_id
		 * so remember it and restore it after delete_monster_idx()
		 * does its work.
		 */
		struct ghost_info preserved_ghost = *dest->ghost;

		delete_monster_idx(dest, skipped_ghost_id);
		*dest->ghost = preserved_ghost;
		/*
		 * Compensate for the change to monster rating, but do
		 * nothing if it saturated:  do not know what to subtract
		 * in that case.
		 */
		if (dest->mon_rating != UINT32_MAX) {
			assert(dest->mon_rating >= 10);
			dest->mon_rating -= 10;
		}
	}

	return true;
}